

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filereader.cpp
# Opt level: O0

string * getFilenameExt(string *filename)

{
  ulong uVar1;
  ulong uVar2;
  string *in_RSI;
  string *in_RDI;
  size_t found;
  string *name;
  string local_40 [32];
  ulong local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  uVar1 = std::__cxx11::string::find_last_of((char *)in_RDI,0x88c9b3);
  local_20 = uVar1;
  uVar2 = std::__cxx11::string::size();
  if (uVar1 < uVar2) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)in_RDI);
    std::__cxx11::string::operator=((string *)in_RDI,local_40);
    std::__cxx11::string::~string(local_40);
  }
  else {
    std::__cxx11::string::operator=((string *)in_RDI,"");
  }
  return in_RDI;
}

Assistant:

static const std::string getFilenameExt(const std::string filename) {
  // Extract file name extension
  std::string name = filename;
  std::size_t found = name.find_last_of(".");
  if (found < name.size()) {
    name = name.substr(found + 1);
  } else {
    name = "";
  }
  return name;
}